

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O2

void Sim_UtilCountPairsAllPrint(Sym_Man_t *p)

{
  abctime aVar1;
  Extra_BitMat_t *pMat;
  Vec_Int_t *vSupport;
  abctime aVar2;
  uint i;
  
  aVar1 = Abc_Clock();
  for (i = 0; (int)i < p->nOutputs; i = i + 1) {
    printf("Output %2d :",(ulong)i);
    pMat = (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrSymms,i);
    vSupport = Vec_VecEntryInt(p->vSupports,i);
    Sim_UtilCountPairsOnePrint(pMat,vSupport);
    putchar(10);
  }
  aVar2 = Abc_Clock();
  p->timeCount = p->timeCount + (aVar2 - aVar1);
  return;
}

Assistant:

void Sim_UtilCountPairsAllPrint( Sym_Man_t * p )
{
    int i;
    abctime clk;
clk = Abc_Clock();
    for ( i = 0; i < p->nOutputs; i++ )
    {
        printf( "Output %2d :", i );
        Sim_UtilCountPairsOnePrint( (Extra_BitMat_t *)Vec_PtrEntry(p->vMatrSymms, i), Vec_VecEntryInt(p->vSupports, i) );
        printf( "\n" );
    }
p->timeCount += Abc_Clock() - clk;
}